

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O1

csp_conn_t * csp_conn_allocate(csp_conn_type_t type)

{
  csp_conn_t *pcVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  uVar3 = (ulong)csp_conn_allocate::csp_conn_last_given;
  iVar4 = 7;
  pcVar1 = (csp_conn_t *)0x0;
  do {
    uVar2 = (int)uVar3 + 1U & 7;
    uVar3 = (ulong)uVar2;
    LOCK();
    bVar6 = arr_conn[uVar3].state == 0;
    if (bVar6) {
      arr_conn[uVar3].state = 1;
    }
    UNLOCK();
    if (bVar6) {
      pcVar1 = arr_conn + uVar3;
      csp_conn_allocate::csp_conn_last_given = (uint8_t)uVar2;
    }
    bVar5 = iVar4 != 0;
    iVar4 = iVar4 + -1;
  } while (!bVar6 && bVar5);
  if (pcVar1 == (csp_conn_t *)0x0) {
    csp_dbg_conn_out = csp_dbg_conn_out + '\x01';
    pcVar1 = (csp_conn_t *)0x0;
  }
  else {
    pcVar1->timestamp = 0;
    LOCK();
    pcVar1->type = type;
    UNLOCK();
    (pcVar1->idin).flags = '\0';
    (pcVar1->idout).flags = '\0';
  }
  return pcVar1;
}

Assistant:

csp_conn_t * csp_conn_allocate(csp_conn_type_t type) {

	static uint8_t csp_conn_last_given = 0;

	/* Search for free connection */
	csp_conn_t * conn = NULL;
	int i = csp_conn_last_given;
	for (int j = 0; j < CSP_CONN_MAX; j++) {
		i = (i + 1) % CSP_CONN_MAX;

		int expected = CONN_CLOSED;
		if (atomic_compare_exchange_strong(&arr_conn[i].state, &expected, CONN_OPEN)) {
			conn = &arr_conn[i];
			csp_conn_last_given = i;
			break;
		}
	}

	if (conn == NULL) {
		csp_dbg_conn_out++;
		return NULL;
	}

	conn->timestamp = 0;
	conn->type = type;
	conn->idin.flags = 0;
	conn->idout.flags = 0;
	return conn;
}